

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t __thiscall Catch::clara::TextFlow::Column::iterator::indent(iterator *this)

{
  size_t sVar1;
  
  if ((this->m_stringIndex == 0 && this->m_pos == 0) &&
     (sVar1 = this->m_column->m_initialIndent, sVar1 != 0xffffffffffffffff)) {
    return sVar1;
  }
  return this->m_column->m_indent;
}

Assistant:

auto indent() const -> size_t {
            auto initial = m_pos == 0 && m_stringIndex == 0 ? m_column.m_initialIndent : std::string::npos;
            return initial == std::string::npos ? m_column.m_indent : initial;
          }